

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

int pm_to_cham(int mndx)

{
  undefined4 local_10;
  int mcham;
  int mndx_local;
  
  if (mndx == 0x117) {
    local_10 = 2;
  }
  else if (mndx == 0x148) {
    local_10 = 3;
  }
  else if (mndx == 0x155) {
    local_10 = 1;
  }
  else {
    local_10 = 0;
  }
  return local_10;
}

Assistant:

int pm_to_cham(int mndx)
{
	int mcham;

	switch (mndx) {
	case PM_CHAMELEON:	mcham = CHAM_CHAMELEON; break;
	case PM_DOPPELGANGER:	mcham = CHAM_DOPPELGANGER; break;
	case PM_SANDESTIN:	mcham = CHAM_SANDESTIN; break;
	default: mcham = CHAM_ORDINARY; break;
	}
	return mcham;
}